

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

bool __thiscall llama_grammar_parser::parse(llama_grammar_parser *this,char *src)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  pointer pvVar3;
  pointer pvVar4;
  pointer plVar5;
  undefined1 auVar6 [16];
  char *src_00;
  long lVar7;
  runtime_error *prVar8;
  pointer pvVar9;
  ulong uVar10;
  pointer pvVar11;
  _Rb_tree_node_base *p_Var12;
  pointer plVar13;
  undefined1 auVar14 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (src_00 = parse_space(src,true); *src_00 != '\0'; src_00 = parse_rule(this,src_00)) {
  }
  p_Var2 = (this->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pvVar3 = (this->rules).
           super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar6._8_8_ = pvVar3;
  auVar6._0_8_ = p_Var2;
  pvVar4 = (this->rules).
           super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pvVar4 - (long)pvVar3;
  pvVar9 = (pointer)(lVar7 % 0x18);
  pvVar11 = pvVar3;
  while( true ) {
    if (pvVar11 == pvVar4) {
      return true;
    }
    plVar13 = (pvVar11->
              super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>).
              _M_impl.super__Vector_impl_data._M_start;
    plVar5 = (pvVar11->
             super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (plVar13 == plVar5) break;
    for (; auVar14._8_8_ = pvVar9, auVar14._0_8_ = p_Var2, plVar13 != plVar5; plVar13 = plVar13 + 1)
    {
      if (plVar13->type == LLAMA_GRETYPE_RULE_REF) {
        _Var1 = plVar13->value;
        uVar10 = (ulong)_Var1;
        if (((ulong)(lVar7 / 0x18) <= uVar10) ||
           (pvVar9 = pvVar3, auVar14 = auVar6,
           pvVar3[uVar10].
           super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>._M_impl
           .super__Vector_impl_data._M_start ==
           pvVar3[uVar10].
           super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>._M_impl
           .super__Vector_impl_data._M_finish)) {
          while( true ) {
            pvVar9 = auVar14._8_8_;
            p_Var12 = auVar14._0_8_;
            if ((_Rb_tree_header *)p_Var12 == &(this->symbol_ids)._M_t._M_impl.super__Rb_tree_header
               ) break;
            if (p_Var12[2]._M_color == _Var1) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_70,"Undefined rule identifier \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var12 + 1));
              std::operator+(&local_50,&local_70,"\'");
              std::runtime_error::runtime_error(prVar8,(string *)&local_50);
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            auVar14 = std::_Rb_tree_increment(p_Var12);
          }
        }
      }
    }
    pvVar11 = pvVar11 + 1;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10,pvVar11,pvVar9);
  std::runtime_error::runtime_error(prVar8,"Undefined rule");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool llama_grammar_parser::parse(const char * src) {
    try {
        const char * pos = parse_space(src, true);
        while (*pos) {
            pos = parse_rule(pos);
        }
        // Validate the state to ensure that all rules are defined
        for (const auto & rule : rules) {
            if (rule.empty()) {
                throw std::runtime_error("Undefined rule");
            }
            for (const auto & elem : rule) {
                if (elem.type == LLAMA_GRETYPE_RULE_REF) {
                    // Ensure that the rule at that location exists
                    if (elem.value >= rules.size() || rules[elem.value].empty()) {
                        // Get the name of the rule that is missing
                        for (const auto & kv : symbol_ids) {
                            if (kv.second == elem.value) {
                                throw std::runtime_error("Undefined rule identifier '" + kv.first + "'");
                            }
                        }
                    }
                }
            }
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "%s: error parsing grammar: %s\n\n%s\n", __func__, err.what(), src);
        rules.clear();
        return false;
    }

    return true;
}